

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  UnitTest *this;
  char *pcVar5;
  char **__envp;
  bool bVar6;
  String *in_stack_ffffffffffffff30;
  String *this_00;
  String local_90;
  String local_80;
  String local_70;
  String local_60;
  char *local_50;
  char *original_dir;
  String local_38;
  int local_24;
  long *plStack_20;
  int gtest_retval;
  ExecDeathTestArgs *args;
  void *child_arg_local;
  
  plStack_20 = (long *)child_arg;
  args = (ExecDeathTestArgs *)child_arg;
  do {
    do {
      local_24 = close((int)plStack_20[1]);
      bVar6 = false;
      if (local_24 == -1) {
        piVar4 = __errno_location();
        bVar6 = *piVar4 == 4;
      }
    } while (bVar6);
    if (local_24 == -1) {
      String::Format(&local_38,"CHECK failed: File %s, line %d: %s != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x386,"close(args->close_fd)");
      DeathTestAbort(&local_38);
      String::~String(in_stack_ffffffffffffff30);
    }
    bVar6 = AlwaysFalse();
  } while (bVar6);
  this = UnitTest::GetInstance();
  local_50 = UnitTest::original_working_dir(this);
  iVar3 = chdir(local_50);
  pcVar1 = local_50;
  if (iVar3 == 0) {
    this_00 = (String *)*plStack_20;
    pcVar1 = this_00->c_str_;
    __envp = GetEnviron();
    execve(pcVar1,&this_00->c_str_,__envp);
    pcVar1 = local_50;
    uVar2 = *(undefined8 *)*plStack_20;
    GetLastErrnoDescription();
    pcVar5 = String::c_str(&local_90);
    String::Format(&local_80,"execve(%s, ...) in %s failed: %s",uVar2,pcVar1,pcVar5);
    DeathTestAbort(&local_80);
    String::~String(this_00);
    String::~String(this_00);
  }
  else {
    GetLastErrnoDescription();
    pcVar5 = String::c_str(&local_70);
    String::Format(&local_60,"chdir(\"%s\") failed: %s",pcVar1,pcVar5);
    DeathTestAbort(&local_60);
    String::~String(in_stack_ffffffffffffff30);
    String::~String(in_stack_ffffffffffffff30);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(String::Format("chdir(\"%s\") failed: %s",
                                  original_dir,
                                  GetLastErrnoDescription().c_str()));
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(String::Format("execve(%s, ...) in %s failed: %s",
                                args->argv[0],
                                original_dir,
                                GetLastErrnoDescription().c_str()));
  return EXIT_FAILURE;
}